

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiobj_data.c
# Opt level: O0

FIOBJ fiobj_data_alloc(void *buffer,int fd)

{
  void *__dest;
  int *piVar1;
  undefined1 local_58 [4];
  undefined4 local_54;
  void *local_50;
  undefined1 auStack_48 [8];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  int local_28;
  void *local_20;
  fiobj_data_s *io;
  void *pvStack_10;
  int fd_local;
  void *buffer_local;
  
  io._4_4_ = fd;
  pvStack_10 = buffer;
  __dest = fio_malloc(0x38);
  local_20 = __dest;
  if (__dest == (void *)0x0) {
    perror("FATAL ERROR: fiobj IO couldn\'t allocate memory");
    piVar1 = __errno_location();
    exit(*piVar1);
  }
  local_58[0] = 0x2b;
  local_54 = 1;
  local_50 = pvStack_10;
  memset(auStack_48,0,8);
  local_40 = 0;
  local_38 = 0;
  local_30 = 0;
  local_28 = io._4_4_;
  memcpy(__dest,local_58,0x38);
  return (FIOBJ)local_20;
}

Assistant:

static FIOBJ fiobj_data_alloc(void *buffer, int fd) {
  fiobj_data_s *io = fio_malloc(sizeof(*io));
  REQUIRE_MEM(io);
  *io = (fiobj_data_s){
      .head = {.ref = 1, .type = FIOBJ_T_DATA},
      .buffer = buffer,
      .fd = fd,
  };
  return (FIOBJ)io;
}